

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

time_t get_time(int ttime)

{
  time_t tVar1;
  undefined1 local_48 [8];
  tm tm;
  int ttime_local;
  
  local_48._0_4_ = (ttime & 0x1fU) << 1;
  local_48._4_4_ = ttime >> 5 & 0x3f;
  tm.tm_sec = ttime >> 0xb & 0x1f;
  tm.tm_min = ttime >> 0x10 & 0x1f;
  tm.tm_hour = (ttime >> 0x15 & 0xfU) - 1;
  tm.tm_mday = (ttime >> 0x19 & 0x7fU) + 0x50;
  tm.tm_wday = -1;
  tm.tm_zone._4_4_ = ttime;
  tVar1 = mktime((tm *)local_48);
  return tVar1;
}

Assistant:

static time_t
get_time(int ttime)
{
  struct tm tm;
  tm.tm_sec = 2 * (ttime & 0x1f);
  tm.tm_min = (ttime >> 5) & 0x3f;
  tm.tm_hour = (ttime >> 11) & 0x1f;
  tm.tm_mday = (ttime >> 16) & 0x1f;
  tm.tm_mon = ((ttime >> 21) & 0x0f) - 1;
  tm.tm_year = ((ttime >> 25) & 0x7f) + 80;
  tm.tm_isdst = -1;
  return mktime(&tm);
}